

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida_ls.c
# Opt level: O2

int idaLsDenseDQJac(sunrealtype tt,sunrealtype c_j,N_Vector yy,N_Vector yp,N_Vector rr,SUNMatrix Jac
                   ,IDAMem IDA_mem,N_Vector tmp1)

{
  long *plVar1;
  double dVar2;
  double dVar3;
  void *pvVar4;
  int iVar5;
  sunindextype sVar6;
  undefined8 uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  sunrealtype *psVar11;
  long j;
  ulong uVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double local_b8;
  long local_a8;
  
  pvVar4 = IDA_mem->ida_lmem;
  sVar6 = SUNDenseMatrix_Columns(Jac);
  uVar7 = N_VCloneEmpty(tmp1);
  lVar8 = N_VGetArrayPointer(IDA_mem->ida_ewt);
  lVar9 = N_VGetArrayPointer(yy);
  lVar10 = N_VGetArrayPointer(yp);
  if (IDA_mem->ida_constraintsSet == 0) {
    local_a8 = 0;
  }
  else {
    local_a8 = N_VGetArrayPointer(IDA_mem->ida_constraints);
  }
  dVar2 = IDA_mem->ida_uround;
  local_b8 = 0.0;
  if (0.0 < dVar2) {
    if (dVar2 < 0.0) {
      local_b8 = sqrt(dVar2);
    }
    else {
      local_b8 = SQRT(dVar2);
    }
  }
  if (sVar6 < 1) {
    sVar6 = 0;
  }
  for (j = 0; sVar6 != j; j = j + 1) {
    psVar11 = SUNDenseMatrix_Column(Jac,j);
    N_VSetArrayPointer(psVar11,uVar7);
    dVar2 = *(double *)(lVar9 + j * 8);
    dVar3 = *(double *)(lVar10 + j * 8);
    dVar13 = IDA_mem->ida_hh * dVar3;
    dVar14 = ABS(dVar13);
    dVar16 = ABS(dVar2);
    if (ABS(dVar2) <= dVar14) {
      dVar16 = dVar14;
    }
    dVar15 = 1.0 / *(double *)(lVar8 + j * 8);
    dVar14 = dVar16 * local_b8;
    if (dVar16 * local_b8 <= dVar15) {
      dVar14 = dVar15;
    }
    uVar12 = -(ulong)(dVar13 < 0.0);
    dVar16 = ((double)((ulong)-dVar14 & uVar12 | ~uVar12 & (ulong)dVar14) + dVar2) - dVar2;
    if (IDA_mem->ida_constraintsSet != 0) {
      dVar13 = *(double *)(local_a8 + j * 8);
      dVar14 = ABS(dVar13);
      if ((dVar14 != 1.0) || (NAN(dVar14))) {
        if ((dVar14 == 2.0) && ((!NAN(dVar14) && ((dVar2 + dVar16) * dVar13 <= 0.0))))
        goto LAB_0011398c;
      }
      else if ((dVar2 + dVar16) * dVar13 < 0.0) {
LAB_0011398c:
        dVar16 = -dVar16;
      }
    }
    *(double *)(lVar9 + j * 8) = dVar2 + dVar16;
    *(double *)(lVar10 + j * 8) = c_j * dVar16 + *(double *)(lVar10 + j * 8);
    iVar5 = (*IDA_mem->ida_res)(tt,yy,yp,tmp1,IDA_mem->ida_user_data);
    plVar1 = (long *)((long)pvVar4 + 0xa8);
    *plVar1 = *plVar1 + 1;
    if (iVar5 != 0) goto LAB_00113a43;
    N_VLinearSum(1.0 / dVar16,-(1.0 / dVar16),tmp1,rr,uVar7);
    *(double *)(lVar9 + j * 8) = dVar2;
    *(double *)(lVar10 + j * 8) = dVar3;
  }
  iVar5 = 0;
LAB_00113a43:
  N_VSetArrayPointer(0,uVar7);
  N_VDestroy(uVar7);
  return iVar5;
}

Assistant:

int idaLsDenseDQJac(sunrealtype tt, sunrealtype c_j, N_Vector yy, N_Vector yp,
                    N_Vector rr, SUNMatrix Jac, IDAMem IDA_mem, N_Vector tmp1)
{
  sunrealtype inc, inc_inv, yj, ypj, srur, conj;
  sunrealtype *y_data, *yp_data, *ewt_data, *cns_data = NULL;
  N_Vector rtemp, jthCol;
  sunindextype j, N;
  IDALsMem idals_mem;
  int retval = 0;

  /* access LsMem interface structure */
  idals_mem = (IDALsMem)IDA_mem->ida_lmem;

  /* access matrix dimension */
  N = SUNDenseMatrix_Columns(Jac);

  /* Rename work vectors for readability */
  rtemp = tmp1;

  /* Create an empty vector for matrix column calculations */
  jthCol = N_VCloneEmpty(tmp1);

  /* Obtain pointers to the data for ewt, yy, yp. */
  ewt_data = N_VGetArrayPointer(IDA_mem->ida_ewt);
  y_data   = N_VGetArrayPointer(yy);
  yp_data  = N_VGetArrayPointer(yp);
  if (IDA_mem->ida_constraintsSet)
  {
    cns_data = N_VGetArrayPointer(IDA_mem->ida_constraints);
  }

  srur = SUNRsqrt(IDA_mem->ida_uround);

  for (j = 0; j < N; j++)
  {
    /* Generate the jth col of J(tt,yy,yp) as delta(F)/delta(y_j). */

    /* Set data address of jthCol, and save y_j and yp_j values. */
    N_VSetArrayPointer(SUNDenseMatrix_Column(Jac, j), jthCol);
    yj  = y_data[j];
    ypj = yp_data[j];

    /* Set increment inc to y_j based on sqrt(uround)*abs(y_j), with
    adjustments using yp_j and ewt_j if this is small, and a further
    adjustment to give it the same sign as hh*yp_j. */

    inc = SUNMAX(srur * SUNMAX(SUNRabs(yj), SUNRabs(IDA_mem->ida_hh * ypj)),
                 ONE / ewt_data[j]);

    if (IDA_mem->ida_hh * ypj < ZERO) { inc = -inc; }
    inc = (yj + inc) - yj;

    /* Adjust sign(inc) again if y_j has an inequality constraint. */
    if (IDA_mem->ida_constraintsSet)
    {
      conj = cns_data[j];
      if (SUNRabs(conj) == ONE)
      {
        if ((yj + inc) * conj < ZERO) { inc = -inc; }
      }
      else if (SUNRabs(conj) == TWO)
      {
        if ((yj + inc) * conj <= ZERO) { inc = -inc; }
      }
    }

    /* Increment y_j and yp_j, call res, and break on error return. */
    y_data[j] += inc;
    yp_data[j] += c_j * inc;

    retval = IDA_mem->ida_res(tt, yy, yp, rtemp, IDA_mem->ida_user_data);
    idals_mem->nreDQ++;
    if (retval != 0) { break; }

    /* Construct difference quotient in jthCol */
    inc_inv = ONE / inc;
    N_VLinearSum(inc_inv, rtemp, -inc_inv, rr, jthCol);

    /*  reset y_j, yp_j */
    y_data[j]  = yj;
    yp_data[j] = ypj;
  }

  /* Destroy jthCol vector */
  N_VSetArrayPointer(NULL, jthCol); /* SHOULDN'T BE NEEDED */
  N_VDestroy(jthCol);

  return (retval);
}